

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O2

void gba_write_byte(uint32_t addr,uint8_t value,access_type_t access_type)

{
  long lVar1;
  ushort uVar2;
  bool bVar3;
  _Bool _Var4;
  uint8_t uVar5;
  ushort uVar6;
  gba_ppu_t **ppgVar7;
  byte bVar8;
  uint uVar9;
  gbabus_t *pgVar10;
  gbabus_t **ppgVar11;
  ulong uVar12;
  int *piVar13;
  ulong uVar14;
  gba_ppu_t *pgVar15;
  ulong uVar16;
  uint16_t uVar17;
  uint mask;
  ushort uVar18;
  int channel;
  char *pcVar19;
  uint uVar20;
  size_t sStack_30;
  
  uVar9 = addr >> 0x18;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar13 = nonsequential_byte_half_cycles;
LAB_0010f957:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar13[uVar9];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar13 = sequential_byte_half_cycles;
    goto LAB_0010f957;
  }
  if (0xf < uVar9) {
    return;
  }
  uVar14 = (ulong)value;
  switch((ulong)uVar9) {
  case 0:
    if (gba_log_verbosity != 0) {
      pcVar19 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_0010fda6:
      printf(pcVar19);
      return;
    }
    break;
  case 1:
  case 7:
    break;
  case 2:
    mem->ewram[addr & 0x3ffff] = value;
    break;
  case 3:
    mem->iwram[addr & 0x7fff] = value;
    break;
  case 4:
    if (0x40003ff < addr) {
      return;
    }
    _Var4 = is_ioreg_writable(addr);
    if (!_Var4) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar19 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
      goto LAB_0010f9d9;
    }
    uVar5 = get_ioreg_size_for_addr(addr);
    pgVar10 = bus;
    pgVar15 = ppu;
    if (uVar5 == '\x04') {
      bVar8 = (char)addr * '\b';
      uVar9 = (uint)value << (bVar8 & 0x1f);
      mask = 0xff << (bVar8 & 0x1f);
      uVar20 = addr & 0xffc;
      if ((0x3c < uVar20) || ((0x1100110000000000U >> ((ulong)uVar20 & 0x3f) & 1) == 0)) {
        if (uVar20 == 0xa4) {
          channel = 1;
LAB_0010ff7b:
          write_fifo(apu,channel,uVar9,mask);
          return;
        }
        if (uVar20 == 0xa0) {
          channel = 0;
          goto LAB_0010ff7b;
        }
        addr = addr & 0x7fffffc;
        _Var4 = is_ioreg_writable(addr);
        if (!_Var4) {
          if (gba_log_verbosity == 0) {
            return;
          }
          pcVar19 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          goto LAB_0010f9d9;
        }
        uVar5 = get_ioreg_size_for_addr(addr);
        if (uVar5 != '\x04') {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x25f);
          fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                  "Trying to get the address of a wrong-sized word ioreg");
          goto LAB_001106c9;
        }
        ppgVar7 = &ppu;
        if (uVar20 == 0x28) {
          sStack_30 = 0x3ecac;
          goto LAB_00110634;
        }
        if (uVar20 != 0x800) {
          if (uVar20 == 0x38) {
            sStack_30 = 0x3ecbc;
            goto LAB_00110634;
          }
          if (uVar20 == 0x3c) {
            sStack_30 = 0x3ecc4;
            goto LAB_00110634;
          }
          if ((uVar20 != 0xa0) && (uVar20 != 0xa4)) {
            if (uVar20 == 0xb0) {
              sStack_30 = 0x10;
            }
            else if (uVar20 == 0xb4) {
              sStack_30 = 0x14;
            }
            else if (uVar20 == 0xbc) {
              sStack_30 = 0x30;
            }
            else if (uVar20 == 0xc0) {
              sStack_30 = 0x34;
            }
            else if (uVar20 == 200) {
              sStack_30 = 0x50;
            }
            else if (uVar20 == 0xcc) {
              sStack_30 = 0x54;
            }
            else if (uVar20 == 0xd4) {
              sStack_30 = 0x70;
            }
            else {
              if (uVar20 != 0xd8) {
                if ((uVar20 != 0x150) && (uVar20 != 0x154)) {
                  if (uVar20 == 0x2c) {
                    sStack_30 = 0x3ecb4;
                    goto LAB_00110634;
                  }
                  fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                          "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                          ,0x273);
                  pcVar19 = 
                  "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                  ;
                  uVar14 = (ulong)addr;
                  goto LAB_00110708;
                }
                goto LAB_00110159;
              }
              sStack_30 = 0x74;
            }
            ppgVar7 = (gba_ppu_t **)&bus;
LAB_00110634:
            uVar20 = *(uint *)((long)((*ppgVar7)->screen + -1) + 0x3be + sStack_30);
            *(uint *)((long)((*ppgVar7)->screen + -1) + 0x3be + sStack_30) =
                 (uVar9 ^ uVar20) & mask ^ uVar20;
            return;
          }
        }
LAB_00110159:
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar19 = "\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
        ;
        uVar12 = (ulong)addr;
        uVar14 = (ulong)mask;
LAB_0010fd82:
        printf(pcVar19,uVar12,uVar14);
        return;
      }
      if ((uVar20 - 0x28 < 0x18) &&
         (uVar20 = uVar20 - 0x28 >> 2, (0x33U >> (uVar20 & 0x1f) & 1) != 0)) {
        lVar1 = *(long *)(&DAT_00124228 + (ulong)uVar20 * 8);
        if (ppu->y == 0xe3 || ppu->y < 0xa1) {
          *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00124258 + (ulong)uVar20 * 8))
               = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00124258 + (ulong)uVar20 * 8)) & ~mask | uVar9 & mask;
        }
        *(uint *)((long)(pgVar15->screen + -1) + 0x3be + lVar1) =
             ~mask & *(uint *)((long)(pgVar15->screen + -1) + 0x3be + lVar1) | uVar9 & mask;
        return;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x298);
      pcVar19 = "Fatal error- should not have ended up here.\n\x1b[0;m";
      sStack_30 = 0x31;
LAB_001107ab:
      fwrite(pcVar19,sStack_30,1,_stderr);
LAB_001106c9:
      exit(1);
    }
    if (uVar5 != '\x02') {
      if ((addr & 0xfff) == 0x300) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar19 = "\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m";
        goto LAB_0010fda6;
      }
      if ((addr & 0xfff) != 0x301) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x141);
        pcVar19 = "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m";
        uVar16 = (ulong)addr;
        uVar12 = uVar14;
        goto LAB_001106c2;
      }
      if ((value & 1) == 0) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        return;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x139);
      pcVar19 = "Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m";
      sStack_30 = 0x29;
      goto LAB_001107ab;
    }
    bVar8 = (char)addr * '\b' & 8;
    uVar2 = (ushort)value << bVar8;
    uVar9 = addr & 0xffe;
    uVar6 = (ushort)(0xff << bVar8);
    ppgVar11 = (gbabus_t **)&ppu;
    switch(uVar9) {
    case 0:
      sStack_30 = 0x3ec34;
      break;
    case 2:
      if (gba_log_verbosity == 0) {
        return;
      }
      printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
      goto LAB_00110127;
    case 4:
      pgVar15 = (gba_ppu_t *)&ppu->DISPSTAT;
      uVar6 = uVar6 & 0xfff8;
      goto LAB_0011053e;
    case 6:
      ppgVar11 = (gbabus_t **)&ppu;
LAB_00110336:
      pgVar15 = (gba_ppu_t *)*ppgVar11;
      if (pgVar15 != (gba_ppu_t *)0x0) {
        if (uVar9 == 0x208) {
          uVar6 = 1;
LAB_0011053e:
          ((DISPSTAT_t *)&pgVar15->y)->raw =
               (uVar2 ^ ((DISPSTAT_t *)&pgVar15->y)->raw) & uVar6 ^ ((DISPSTAT_t *)&pgVar15->y)->raw
          ;
          return;
        }
        if (uVar9 == 0x202) {
switchD_00110153_caseD_202:
          (bus->IF).raw = (bus->IF).raw & ~uVar2;
          return;
        }
        uVar18 = ((DISPSTAT_t *)&pgVar15->y)->raw;
        ((DISPSTAT_t *)&pgVar15->y)->raw = (uVar2 ^ uVar18) & uVar6 ^ uVar18;
        if (uVar9 == 0xb8) goto LAB_00110529;
        if (uVar9 == 0x204) {
LAB_001101a2:
          on_waitcnt_updated();
          return;
        }
        if (uVar9 == 0xc4) goto LAB_00110529;
        pgVar10 = bus;
        if (uVar9 == 0xc6) {
          uVar17 = (bus->DMA1CNT_H).raw;
LAB_001104b2:
          if (-1 < (short)uVar17) {
            (pgVar10->DMA1INT).previously_enabled = false;
          }
          goto LAB_00110529;
        }
        if (uVar9 == 0xd0) goto LAB_00110529;
        if (uVar9 == 0xd2) {
          uVar17 = (bus->DMA2CNT_H).raw;
LAB_0011045b:
          if (-1 < (short)uVar17) {
            (pgVar10->DMA2INT).previously_enabled = false;
          }
          goto LAB_00110529;
        }
        if (uVar9 == 0xdc) goto LAB_00110529;
        if (uVar9 == 0xde) {
          uVar17 = (bus->DMA3CNT_H).raw;
LAB_00110485:
          if (-1 < (short)uVar17) {
            (pgVar10->DMA3INT).previously_enabled = false;
          }
          goto LAB_00110529;
        }
        if (uVar9 == 0x102) goto LAB_0011027b;
        if (uVar9 == 0x106) goto LAB_0011021c;
        if (uVar9 == 0x10a) goto LAB_00110241;
        if (uVar9 != 0x10e) {
          if (uVar9 != 0xba) {
            return;
          }
          uVar17 = (bus->DMA0CNT_H).raw;
          goto LAB_001104ff;
        }
LAB_001101ed:
        sStack_30._0_4_ = 3;
LAB_00110280:
        tmcnth_write((int)sStack_30,uVar18);
        return;
      }
LAB_00110127:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar19 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
      addr = addr & 0x7fffffe;
LAB_0010f9d9:
      printf(pcVar19,(ulong)addr);
      return;
    case 8:
      sStack_30 = 0x3ec38;
      break;
    case 10:
      sStack_30 = 0x3ec3c;
      break;
    case 0xc:
      sStack_30 = 0x3ec40;
      break;
    case 0xe:
      sStack_30 = 0x3ec44;
      break;
    case 0x10:
      sStack_30 = 0x3ec48;
      break;
    case 0x12:
      sStack_30 = 0x3ec4c;
      break;
    case 0x14:
      sStack_30 = 0x3ec50;
      break;
    case 0x16:
      sStack_30 = 0x3ec54;
      break;
    case 0x18:
      sStack_30 = 0x3ec58;
      break;
    case 0x1a:
      sStack_30 = 0x3ec5c;
      break;
    case 0x1c:
      sStack_30 = 0x3ec60;
      break;
    case 0x1e:
      sStack_30 = 0x3ec64;
      break;
    case 0x20:
      sStack_30 = 0x3ec68;
      break;
    case 0x22:
      sStack_30 = 0x3ec6c;
      break;
    case 0x24:
      sStack_30 = 0x3ec70;
      break;
    case 0x26:
      sStack_30 = 0x3ec74;
      break;
    case 0x28:
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x38:
    case 0x3a:
    case 0x3c:
    case 0x3e:
    case 0x4e:
switchD_00110153_caseD_206:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x1ce);
      pcVar19 = "Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m";
      uVar14 = (ulong)(addr & 0x7fffffe);
      goto LAB_00110708;
    case 0x30:
      sStack_30 = 0x3ec78;
      break;
    case 0x32:
      sStack_30 = 0x3ec7c;
      break;
    case 0x34:
      sStack_30 = 0x3ec80;
      break;
    case 0x36:
      sStack_30 = 0x3ec84;
      break;
    case 0x40:
      sStack_30 = 0x3ec88;
      break;
    case 0x42:
      sStack_30 = 0x3ec8c;
      break;
    case 0x44:
      sStack_30 = 0x3ec90;
      break;
    case 0x46:
      sStack_30 = 0x3ec94;
      break;
    case 0x48:
      sStack_30 = 0x3ec98;
      break;
    case 0x4a:
      sStack_30 = 0x3ec9a;
      break;
    case 0x4c:
      sStack_30 = 0x3ec9c;
      break;
    case 0x50:
      sStack_30 = 0x3eca0;
      break;
    case 0x52:
      sStack_30 = 0x3eca4;
      break;
    case 0x54:
      sStack_30 = 0x3eca8;
      break;
    default:
      switch(uVar9) {
      case 0x120:
      case 0x122:
      case 0x124:
      case 0x126:
      case 0x128:
      case 0x12a:
switchD_001100a5_caseD_120:
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar19 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
LAB_0011011d:
        printf(pcVar19,(ulong)uVar9);
        goto LAB_00110127;
      case 300:
      case 0x12e:
        goto switchD_00110153_caseD_206;
      case 0x130:
        sStack_30 = 8;
        break;
      case 0x132:
        sStack_30 = 0x94;
        break;
      case 0x134:
        sStack_30 = 0x90;
        break;
      default:
        switch(uVar9) {
        case 0x100:
          sStack_30 = 0xa2;
          break;
        case 0x102:
          uVar18 = bus->TMCNT_H[0].raw;
          bus->TMCNT_H[0].raw = (uVar2 ^ uVar18) & uVar6 ^ uVar18;
LAB_0011027b:
          sStack_30._0_4_ = 0;
          goto LAB_00110280;
        case 0x104:
          sStack_30 = 0xa4;
          break;
        case 0x106:
          uVar18 = bus->TMCNT_H[1].raw;
          bus->TMCNT_H[1].raw = (uVar2 ^ uVar18) & uVar6 ^ uVar18;
LAB_0011021c:
          sStack_30._0_4_ = 1;
          goto LAB_00110280;
        case 0x108:
          sStack_30 = 0xa6;
          break;
        case 0x10a:
          uVar18 = bus->TMCNT_H[2].raw;
          bus->TMCNT_H[2].raw = (uVar2 ^ uVar18) & uVar6 ^ uVar18;
LAB_00110241:
          sStack_30._0_4_ = 2;
          goto LAB_00110280;
        case 0x10c:
          sStack_30 = 0xa8;
          break;
        case 0x10e:
          uVar18 = bus->TMCNT_H[3].raw;
          bus->TMCNT_H[3].raw = (uVar2 ^ uVar18) & uVar6 ^ uVar18;
          goto LAB_001101ed;
        default:
          switch(uVar9) {
          case 0x80:
          case 0x82:
          case 0x84:
switchD_00110104_caseD_80:
            if (gba_log_verbosity == 0) {
              return;
            }
            pcVar19 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
            goto LAB_0011011d;
          case 0x86:
            goto switchD_00110153_caseD_206;
          case 0x88:
            sStack_30 = 0x96;
            break;
          default:
            switch(uVar9) {
            case 0x200:
              sStack_30 = 4;
              break;
            case 0x202:
              goto switchD_00110153_caseD_202;
            case 0x204:
              (bus->WAITCNT).raw = (uVar2 ^ (bus->WAITCNT).raw) & uVar6 ^ (bus->WAITCNT).raw;
              goto LAB_001101a2;
            case 0x206:
              goto switchD_00110153_caseD_206;
            case 0x208:
              ppgVar11 = &bus;
              goto LAB_00110336;
            default:
              if ((((((uVar9 != 0x60) && (uVar9 != 0x62)) && (uVar9 != 100)) &&
                   (((uVar9 != 0x68 && (uVar9 != 0x6c)) &&
                    ((uVar9 != 0x70 && ((uVar9 != 0x72 && (uVar9 != 0x74)))))))) &&
                  ((uVar9 != 0x78 && (((uVar9 != 0x7c && (uVar9 != 0x90)) && (uVar9 != 0x92)))))) &&
                 (((uVar9 != 0x94 && (uVar9 != 0x96)) &&
                  (((uVar9 != 0x98 && ((uVar9 != 0x9a && (uVar9 != 0x9c)))) && (uVar9 != 0x9e))))))
              {
                if (uVar9 == 0xb8) {
                  sStack_30 = 0x18;
                }
                else {
                  if (uVar9 == 0xba) {
                    uVar17 = (uVar2 ^ (bus->DMA0CNT_H).raw) & uVar6 ^ (bus->DMA0CNT_H).raw;
                    (bus->DMA0CNT_H).raw = uVar17;
LAB_001104ff:
                    if (-1 < (short)uVar17) {
                      (pgVar10->DMA0INT).previously_enabled = false;
                    }
                    goto LAB_00110529;
                  }
                  if (uVar9 == 0xc4) {
                    sStack_30 = 0x38;
                  }
                  else {
                    if (uVar9 == 0xc6) {
                      uVar17 = (uVar2 ^ (bus->DMA1CNT_H).raw) & uVar6 ^ (bus->DMA1CNT_H).raw;
                      (bus->DMA1CNT_H).raw = uVar17;
                      goto LAB_001104b2;
                    }
                    if (uVar9 == 0xd0) {
                      sStack_30 = 0x58;
                    }
                    else {
                      if (uVar9 == 0xd2) {
                        uVar17 = (uVar2 ^ (bus->DMA2CNT_H).raw) & uVar6 ^ (bus->DMA2CNT_H).raw;
                        (bus->DMA2CNT_H).raw = uVar17;
                        goto LAB_0011045b;
                      }
                      if (uVar9 != 0xdc) {
                        if (uVar9 != 0xde) {
                          if (uVar9 == 0x140) {
                            sStack_30 = 0x92;
                            break;
                          }
                          if (((uVar9 == 0x150) || (uVar9 == 0x154)) || (uVar9 == 0x158))
                          goto switchD_001100a5_caseD_120;
                          goto switchD_00110153_caseD_206;
                        }
                        uVar17 = (uVar2 ^ (bus->DMA3CNT_H).raw) & uVar6 ^ (bus->DMA3CNT_H).raw;
                        (bus->DMA3CNT_H).raw = uVar17;
                        goto LAB_00110485;
                      }
                      sStack_30 = 0x78;
                    }
                  }
                }
                uVar18 = *(ushort *)((long)&bus->interrupt_master_enable + sStack_30);
                *(ushort *)((long)&bus->interrupt_master_enable + sStack_30) =
                     (uVar2 ^ uVar18) & uVar6 ^ uVar18;
LAB_00110529:
                gba_dma();
                return;
              }
              goto switchD_00110104_caseD_80;
            }
          }
        }
      }
      ppgVar11 = &bus;
    }
    uVar18 = *(ushort *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + sStack_30);
    *(ushort *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + sStack_30) =
         (uVar2 ^ uVar18) & uVar6 ^ uVar18;
    break;
  case 5:
    ppu->pram[addr & 0x3fe] = value;
    ppu->pram[(ulong)(addr & 0x3fe) + 1] = value;
    break;
  case 6:
    bVar3 = (addr & 0xffff0000) == 0x6000000;
    if ((ushort)(((ppu->DISPCNT).raw & 7) - 3) < 3) {
      bVar3 = addr + 0xfa000000 < 0x14000;
    }
    if (bVar3) {
      uVar14 = (ulong)(addr + 0xfa000000) % 0x18000;
      ppu->vram[(uint)uVar14 & 0x1fffe] = value;
      ppu->vram[uVar14 | 1] = value;
    }
    break;
  default:
    if ((bus->backup_type != EEPROM) || ((addr < 0xdffff00 && (0x1000000 < mem->rom_size)))) {
      if (gba_log_verbosity < 3) {
        return;
      }
      pcVar19 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
      goto LAB_0010f9d9;
    }
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",0x44c
           );
    pcVar19 = "Write byte 0x%02X to EEPROM at addr 0x%08X\n\x1b[0;m";
    uVar12 = (ulong)addr;
    uVar16 = uVar14;
LAB_001106c2:
    fprintf(_stderr,pcVar19,uVar16,uVar12);
    goto LAB_001106c9;
  case 0xe:
  case 0xf:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity != 0) {
        pcVar19 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
        goto LAB_0010fda6;
      }
      break;
    case SRAM:
      mem->backup[addr & 0x7fff] = value;
      mem->backup_dirty = true;
      break;
    case EEPROM:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar19 = "\x1b[0;33m[WARN]  Ignoring byte write to EEPROM: [0x%08X]=0x%02X\n\x1b[0;m";
      uVar12 = (ulong)addr;
      goto LAB_0010fd82;
    case FLASH64K:
    case FLASH128K:
      write_byte_flash(mem,bus,addr,value);
      return;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x465);
      uVar14 = (ulong)bus->backup_type;
      pcVar19 = "Unknown backup type index %d!\n\x1b[0;m";
LAB_00110708:
      fprintf(_stderr,pcVar19,uVar14);
      goto LAB_001106c9;
    }
  }
  return;
}

Assistant:

void gba_write_byte(word addr, byte value, access_type_t access_type) {
    addr &= ~(sizeof(byte) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(byte), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            mem->ewram[index] = value;
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            mem->iwram[index] = value;
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                write_byte_ioreg(addr, value);
            }
#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr == 0x4FFF700 || addr == 0x4FFF780 || (addr >= 0x4FFF600 && addr < 0x4FFF700)) {
                    mgba_debug_write_byte(addr, value);
                } else {
                    logwarn("Write 0x%02X to 0x%08X\n", value, addr)
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word lower_index = index & 0xFFFFFFFE;
            word upper_index = lower_index + 1;
            ppu->pram[lower_index] = value;
            ppu->pram[upper_index] = value;
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            // Special case for single byte writes to VRAM, OBJ writes are ignored.
            if (is_bg(addr)) {
                word lower_index = index & 0xFFFFFFFE;
                word upper_index = lower_index + 1;
                ppu->vram[lower_index] = value;
                ppu->vram[upper_index] = value;
            }
            break;
        }
        case REGION_OAM: {
            break; // 8 bit writes to OAM are ignored
        }
        case REGION_GAMEPAK0_L:
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write byte 0x%02X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    mem->backup[addr & 0x7FFF] = value;
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logwarn("Ignoring byte write to EEPROM: [0x%08X]=0x%02X", addr, value)
                    break;
                case FLASH64K:
                case FLASH128K:
                    write_byte_flash(mem, bus, addr, value);
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
            break;
        default:
            return;
    }
}